

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_target(secp256k1_scalar *target,int mode)

{
  int iVar1;
  secp256k1_scratch_space *scratch;
  long lVar2;
  ulong uVar3;
  code *pcVar4;
  secp256k1_scalar *psVar5;
  long extraout_RDX;
  secp256k1_scratch *scratch_00;
  size_t sVar6;
  secp256k1_gej *r;
  ulong uVar7;
  secp256k1_strauss_point_state *psVar8;
  secp256k1_scalar *psVar9;
  secp256k1_gej *psVar10;
  secp256k1_scratch *scratch_01;
  secp256k1_gej *psVar11;
  secp256k1_sha256 *hash;
  secp256k1_ge *elem;
  code *cb;
  secp256k1_fe *unaff_R12;
  secp256k1_sha256 *acc;
  secp256k1_ge *unaff_R13;
  ulong uVar12;
  secp256k1_scalar *psVar13;
  secp256k1_gej *psVar14;
  secp256k1_scalar n2;
  secp256k1_scalar n1;
  secp256k1_gej ptj;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_ge p;
  secp256k1_gej pj;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  ulong uStack_23b0;
  secp256k1_strauss_state sStack_23a8;
  secp256k1_strauss_point_state sStack_2390;
  secp256k1_fe asStack_1f80 [8];
  secp256k1_ge asStack_1e00 [8];
  size_t *psStack_1ab8;
  secp256k1_gej *psStack_1ab0;
  secp256k1_scalar *psStack_1aa8;
  secp256k1_sha256 *psStack_1aa0;
  secp256k1_gej *psStack_1a98;
  secp256k1_strauss_point_state *psStack_1a90;
  size_t sStack_1a80;
  size_t sStack_1a70;
  secp256k1_scratch asStack_1a68 [2];
  secp256k1_scalar sStack_1a18;
  secp256k1_ge sStack_19f8;
  secp256k1_gej sStack_1990;
  secp256k1_gej sStack_18f8;
  secp256k1_gej sStack_1860;
  secp256k1_gej sStack_17c8;
  secp256k1_gej sStack_1730;
  secp256k1_gej asStack_1698 [2];
  secp256k1_gej asStack_1518 [5];
  secp256k1_strauss_point_state sStack_11d8;
  secp256k1_scratch_space *psStack_dc0;
  secp256k1_sha256 *psStack_db8;
  secp256k1_scalar *psStack_db0;
  secp256k1_gej *psStack_da8;
  secp256k1_gej *psStack_da0;
  secp256k1_scalar *psStack_d98;
  undefined4 uStack_d86;
  undefined2 uStack_d82;
  secp256k1_gej *psStack_d80;
  long lStack_d78;
  secp256k1_scalar sStack_d70;
  secp256k1_scalar sStack_d50;
  secp256k1_sha256 sStack_d30;
  secp256k1_sha256 sStack_cc0;
  secp256k1_gej *psStack_c58;
  secp256k1_fe *psStack_c50;
  secp256k1_ge *psStack_c48;
  secp256k1_ge *psStack_c40;
  secp256k1_gej *psStack_c38;
  secp256k1_strauss_point_state *psStack_c30;
  undefined1 auStack_c28 [32];
  undefined1 local_c08 [40];
  secp256k1_ge *local_be0;
  secp256k1_strauss_point_state *local_bd8;
  secp256k1_gej local_bd0;
  secp256k1_gej local_b38;
  secp256k1_gej local_aa0;
  secp256k1_ge local_a08;
  secp256k1_gej local_9a0;
  secp256k1_fe local_908 [8];
  secp256k1_ge local_788 [8];
  secp256k1_strauss_point_state local_448;
  
  psVar14 = (secp256k1_gej *)auStack_c28;
  psVar8 = (secp256k1_strauss_point_state *)(ulong)(uint)mode;
  psVar13 = (secp256k1_scalar *)local_c08;
  psStack_c30 = (secp256k1_strauss_point_state *)0x158ef0;
  random_scalar_order_test(psVar13);
  psStack_c30 = (secp256k1_strauss_point_state *)0x158f01;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_c28,psVar13,target);
  psStack_c30 = (secp256k1_strauss_point_state *)0x158f0c;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_c28,(secp256k1_scalar *)auStack_c28);
  if (mode == 0) {
    psStack_c30 = (secp256k1_strauss_point_state *)0x159005;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_aa0,(secp256k1_scalar *)local_c08);
    psStack_c30 = (secp256k1_strauss_point_state *)0x15901c;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_b38,(secp256k1_scalar *)auStack_c28);
    psStack_c30 = (secp256k1_strauss_point_state *)0x159030;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_bd0,target);
  }
  else {
    psStack_c30 = (secp256k1_strauss_point_state *)0x158f24;
    random_group_element_test(&local_a08);
    psStack_c30 = (secp256k1_strauss_point_state *)0x158f34;
    secp256k1_gej_set_ge(&local_9a0,&local_a08);
    if (mode == 1) {
      unaff_R12 = local_908;
      unaff_R13 = local_788;
      psVar8 = &local_448;
      psVar13 = &test_ecmult_target::zero;
      psStack_c30 = (secp256k1_strauss_point_state *)0x158f94;
      local_b38.x.n[0] = (uint64_t)unaff_R12;
      local_b38.x.n[1] = (uint64_t)unaff_R13;
      local_b38.x.n[2] = (uint64_t)psVar8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_b38,&local_aa0,1,&local_9a0,
                 (secp256k1_scalar *)local_c08,&test_ecmult_target::zero);
      psStack_c30 = (secp256k1_strauss_point_state *)0x158fbf;
      local_bd0.x.n[0] = (uint64_t)unaff_R12;
      local_bd0.x.n[1] = (uint64_t)unaff_R13;
      local_bd0.x.n[2] = (uint64_t)psVar8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_bd0,&local_b38,1,&local_9a0,
                 (secp256k1_scalar *)auStack_c28,&test_ecmult_target::zero);
      psStack_c30 = (secp256k1_strauss_point_state *)0x158fe7;
      local_c08._32_8_ = unaff_R12;
      local_be0 = unaff_R13;
      local_bd8 = psVar8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(local_c08 + 0x20),&local_bd0,1,&local_9a0,target,
                 &test_ecmult_target::zero);
      psVar14 = &local_9a0;
    }
    else {
      psVar13 = (secp256k1_scalar *)&local_a08;
      psStack_c30 = (secp256k1_strauss_point_state *)0x15904f;
      secp256k1_ecmult_const(&local_aa0,(secp256k1_ge *)psVar13,(secp256k1_scalar *)local_c08);
      psStack_c30 = (secp256k1_strauss_point_state *)0x159062;
      secp256k1_ecmult_const(&local_b38,(secp256k1_ge *)psVar13,(secp256k1_scalar *)auStack_c28);
      psStack_c30 = (secp256k1_strauss_point_state *)0x159072;
      secp256k1_ecmult_const(&local_bd0,(secp256k1_ge *)psVar13,target);
      psVar14 = (secp256k1_gej *)auStack_c28;
    }
  }
  psStack_c30 = (secp256k1_strauss_point_state *)0x15908c;
  secp256k1_gej_add_var(&local_bd0,&local_bd0,&local_aa0,(secp256k1_fe *)0x0);
  psStack_c30 = (secp256k1_strauss_point_state *)0x1590a1;
  psVar10 = &local_bd0;
  secp256k1_gej_add_var(&local_bd0,&local_bd0,&local_b38,(secp256k1_fe *)0x0);
  psStack_c30 = (secp256k1_strauss_point_state *)0x1590a9;
  psVar11 = &local_bd0;
  secp256k1_gej_verify(&local_bd0);
  if (local_bd0.infinity != 0) {
    return;
  }
  psStack_c30 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  psVar9 = (secp256k1_scalar *)((ulong)psVar11 & 0xffffffff);
  psStack_d98 = (secp256k1_scalar *)0x1590f7;
  psStack_d80 = psVar10;
  lStack_d78 = extraout_RDX;
  psStack_c58 = &local_bd0;
  psStack_c50 = unaff_R12;
  psStack_c48 = unaff_R13;
  psStack_c40 = (secp256k1_ge *)psVar13;
  psStack_c38 = psVar14;
  psStack_c30 = psVar8;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_d86 = SUB84(psVar11,0);
  acc = &sStack_cc0;
  sStack_cc0.s[0] = 0x6a09e667;
  sStack_cc0.s[1] = 0xbb67ae85;
  sStack_cc0.s[2] = 0x3c6ef372;
  sStack_cc0.s[3] = 0xa54ff53a;
  sStack_cc0.s[4] = 0x510e527f;
  sStack_cc0.s[5] = 0x9b05688c;
  sStack_cc0.s[6] = 0x1f83d9ab;
  sStack_cc0.s[7] = 0x5be0cd19;
  psVar10 = (secp256k1_gej *)0x0;
  sStack_cc0.bytes = 0;
  sStack_d50.d[0] = 0;
  sStack_d50.d[1] = 0;
  sStack_d50.d[2] = 0;
  sStack_d50.d[3] = 0;
  psStack_d98 = (secp256k1_scalar *)0x159147;
  test_ecmult_accumulate(acc,&sStack_d50,scratch);
  sStack_d50.d[0] = 1;
  sStack_d50.d[1] = 0;
  sStack_d50.d[2] = 0;
  sStack_d50.d[3] = 0;
  psStack_d98 = (secp256k1_scalar *)0x159169;
  test_ecmult_accumulate(acc,&sStack_d50,scratch);
  psStack_d98 = (secp256k1_scalar *)0x159174;
  secp256k1_scalar_negate(&sStack_d50,&sStack_d50);
  psStack_d98 = (secp256k1_scalar *)0x159185;
  test_ecmult_accumulate(acc,&sStack_d50,scratch);
  psVar14 = psStack_d80;
  if (psStack_d80 != (secp256k1_gej *)0x0) {
    psVar10 = (secp256k1_gej *)0x0;
    acc = &sStack_d30;
    psVar9 = &sStack_d70;
    do {
      uStack_d82 = SUB82(psVar10,0);
      sStack_d30.s[0] = 0x6a09e667;
      sStack_d30.s[1] = 0xbb67ae85;
      sStack_d30.s[2] = 0x3c6ef372;
      sStack_d30.s[3] = 0xa54ff53a;
      sStack_d30.s[4] = 0x510e527f;
      sStack_d30.s[5] = 0x9b05688c;
      sStack_d30.s[6] = 0x1f83d9ab;
      sStack_d30.s[7] = 0x5be0cd19;
      sStack_d30.bytes = 0;
      psStack_d98 = (secp256k1_scalar *)0x1591e1;
      secp256k1_sha256_write(acc,(uchar *)&uStack_d86,6);
      psStack_d98 = (secp256k1_scalar *)0x1591ec;
      secp256k1_sha256_finalize(acc,(uchar *)psVar9);
      psStack_d98 = (secp256k1_scalar *)0x1591f9;
      secp256k1_scalar_set_b32(&sStack_d50,(uchar *)psVar9,(int *)0x0);
      psStack_d98 = (secp256k1_scalar *)0x15920c;
      test_ecmult_accumulate(&sStack_cc0,&sStack_d50,scratch);
      psVar10 = (secp256k1_gej *)((long)(psVar10->x).n + 1);
    } while (psVar14 != psVar10);
  }
  hash = &sStack_cc0;
  psVar13 = &sStack_d70;
  psStack_d98 = (secp256k1_scalar *)0x159226;
  secp256k1_sha256_finalize(hash,(uchar *)psVar13);
  lVar2 = 0;
  while (*(char *)((long)sStack_d70.d + lVar2) == *(char *)(lStack_d78 + lVar2)) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x20) {
      psStack_d98 = (secp256k1_scalar *)0x15924e;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return;
    }
  }
  psStack_d98 = (secp256k1_scalar *)test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_da0 = psVar14;
  sStack_1a18.d[2] = 0;
  sStack_1a18.d[3] = 0;
  sStack_1a18.d[0] = 0;
  sStack_1a18.d[1] = 0;
  sStack_1a70 = 0x41;
  psStack_1a90 = (secp256k1_strauss_point_state *)0x1592b0;
  psStack_dc0 = scratch;
  psStack_db8 = acc;
  psStack_db0 = &sStack_d50;
  psStack_da8 = psVar10;
  psStack_d98 = psVar9;
  secp256k1_gej_set_ge(&sStack_18f8,&secp256k1_ge_const_g);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x1592bd;
  secp256k1_gej_set_infinity(&sStack_1990);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x1592d4;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1730,psVar13);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x15931f;
  sStack_1860.x.n[0] = (uint64_t)asStack_1698;
  sStack_1860.x.n[1] = (uint64_t)asStack_1518;
  sStack_1860.x.n[2] = (uint64_t)&sStack_11d8;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1860,&sStack_17c8,1,&sStack_18f8,psVar13,
             &sStack_1a18);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x159355;
  sStack_19f8.x.n[0] = (uint64_t)asStack_1698;
  sStack_19f8.x.n[1] = (uint64_t)asStack_1518;
  sStack_19f8.x.n[2] = (uint64_t)&sStack_11d8;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_19f8,&sStack_1860,1,&sStack_1990,&sStack_1a18,
             psVar13);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x15937b;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch_00,(secp256k1_gej *)&sStack_11d8,psVar13,
             (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  cb = test_ecmult_accumulate_cb;
  psStack_1a90 = (secp256k1_strauss_point_state *)0x1593a5;
  psVar9 = psVar13;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch_00,asStack_1518,&sStack_1a18,
             test_ecmult_accumulate_cb,psVar13,1);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x1593bf;
  secp256k1_ecmult_const(asStack_1698,&secp256k1_ge_const_g,psVar13);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x1593d7;
  secp256k1_ge_set_gej_var(&sStack_19f8,&sStack_1730);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x1593e7;
  ge_equals_gej(&sStack_19f8,&sStack_17c8);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x1593f2;
  ge_equals_gej(&sStack_19f8,&sStack_1860);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x1593fd;
  ge_equals_gej(&sStack_19f8,(secp256k1_gej *)&sStack_11d8);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x159408;
  ge_equals_gej(&sStack_19f8,asStack_1518);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x159413;
  ge_equals_gej(&sStack_19f8,asStack_1698);
  psStack_1a90 = (secp256k1_strauss_point_state *)0x15941b;
  secp256k1_ge_verify(&sStack_19f8);
  if (sStack_19f8.infinity == 0) {
    elem = &sStack_19f8;
    scratch_01 = asStack_1a68;
    psVar13 = (secp256k1_scalar *)0x0;
    psStack_1a90 = (secp256k1_strauss_point_state *)0x159457;
    secp256k1_eckey_pubkey_serialize(elem,scratch_01->magic,&sStack_1a70,0);
    if (sStack_1a70 != 0x41) {
      psStack_1a90 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
      test_ecmult_accumulate_cold_1();
      psStack_1ab8 = &sStack_1a70;
      psStack_1ab0 = asStack_1698;
      psStack_1aa8 = &sStack_1a18;
      psStack_1aa0 = hash;
      psStack_1a98 = &sStack_1860;
      psStack_1a90 = &sStack_11d8;
      secp256k1_gej_set_infinity(r);
      if (psVar13 != (secp256k1_scalar *)0x0 || sStack_1a80 != 0) {
        if (sStack_1a80 == 0) {
          sStack_23a8.aux = asStack_1f80;
          sStack_23a8.pre_a = asStack_1e00;
          sStack_23a8.ps = &sStack_2390;
          secp256k1_ecmult_strauss_wnaf(&sStack_23a8,r,1,r,&secp256k1_scalar_zero,psVar13);
        }
        else {
          if ((scratch_01 == (secp256k1_scratch *)0x0) ||
             (sVar6 = secp256k1_pippenger_max_points((secp256k1_callback *)elem,scratch_01),
             sVar6 == 0)) {
LAB_001596b0:
            secp256k1_ecmult_multi_simple_var(r,psVar13,cb,psVar9,sStack_1a80);
            return;
          }
          uVar3 = 5000000;
          if (sVar6 < 5000000) {
            uVar3 = sVar6;
          }
          uVar12 = sStack_1a80 - 1;
          uStack_23b0 = uVar12 / uVar3 + 1;
          uVar3 = uVar12 / uStack_23b0;
          if (uVar3 < 0x57) {
            lVar2 = 0;
            do {
              if (scratch_01->magic[lVar2] != "scratch"[lVar2]) {
                (*(code *)(elem->x).n[0])("invalid scratch space",(elem->x).n[1]);
                goto LAB_001596b0;
              }
              lVar2 = lVar2 + 1;
            } while (lVar2 != 8);
            uVar7 = scratch_01->max_size - scratch_01->alloc_size;
            uVar3 = 0;
            if (0x4a < uVar7) {
              uVar3 = uVar7 - 0x4b;
            }
            if (uVar3 < 0x988) goto LAB_001596b0;
            uVar3 = uVar3 / 0x988;
            if (4999999 < uVar3) {
              uVar3 = 5000000;
            }
            uStack_23b0 = uVar12 / uVar3 + 1;
            uVar3 = uVar12 / uStack_23b0;
            pcVar4 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar4 = secp256k1_ecmult_pippenger_batch;
          }
          uVar3 = uVar3 + 1;
          lVar2 = 0;
          uVar12 = 0;
          do {
            uVar7 = uVar3;
            if (sStack_1a80 < uVar3) {
              uVar7 = sStack_1a80;
            }
            psVar5 = (secp256k1_scalar *)0x0;
            if (uVar12 == 0) {
              psVar5 = psVar13;
            }
            iVar1 = (*pcVar4)(elem,scratch_01,&sStack_2390,psVar5,cb,psVar9,uVar7,lVar2);
            if (iVar1 == 0) {
              return;
            }
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_2390,(secp256k1_fe *)0x0);
            sStack_1a80 = sStack_1a80 - uVar7;
            uVar12 = uVar12 + 1;
            lVar2 = lVar2 + uVar3;
          } while (uStack_23b0 != uVar12);
        }
      }
      return;
    }
    sVar6 = 0x41;
  }
  else {
    asStack_1a68[0].magic[0] = '\0';
    sVar6 = 1;
  }
  psStack_1a90 = (secp256k1_strauss_point_state *)0x15946f;
  secp256k1_sha256_write(hash,asStack_1a68[0].magic,sVar6);
  return;
}

Assistant:

static void test_ecmult_target(const secp256k1_scalar* target, int mode) {
    /* Mode: 0=ecmult_gen, 1=ecmult, 2=ecmult_const */
    secp256k1_scalar n1, n2;
    secp256k1_ge p;
    secp256k1_gej pj, p1j, p2j, ptj;
    static const secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);

    /* Generate random n1,n2 such that n1+n2 = -target. */
    random_scalar_order_test(&n1);
    secp256k1_scalar_add(&n2, &n1, target);
    secp256k1_scalar_negate(&n2, &n2);

    /* Generate a random input point. */
    if (mode != 0) {
        random_group_element_test(&p);
        secp256k1_gej_set_ge(&pj, &p);
    }

    /* EC multiplications */
    if (mode == 0) {
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p1j, &n1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p2j, &n2);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &ptj, target);
    } else if (mode == 1) {
        secp256k1_ecmult(&p1j, &pj, &n1, &zero);
        secp256k1_ecmult(&p2j, &pj, &n2, &zero);
        secp256k1_ecmult(&ptj, &pj, target, &zero);
    } else {
        secp256k1_ecmult_const(&p1j, &p, &n1);
        secp256k1_ecmult_const(&p2j, &p, &n2);
        secp256k1_ecmult_const(&ptj, &p, target);
    }

    /* Add them all up: n1*P + n2*P + target*P = (n1+n2+target)*P = (n1+n1-n1-n2)*P = 0. */
    secp256k1_gej_add_var(&ptj, &ptj, &p1j, NULL);
    secp256k1_gej_add_var(&ptj, &ptj, &p2j, NULL);
    CHECK(secp256k1_gej_is_infinity(&ptj));
}